

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.cpp
# Opt level: O2

string * __thiscall
gmlc::utilities::base64_decode_to_string_abi_cxx11_
          (string *__return_storage_ptr__,utilities *this,string_view encoded_string,size_t offset)

{
  utilities uVar1;
  byte bVar2;
  byte bVar3;
  char cVar4;
  undefined4 uVar5;
  undefined1 *puVar6;
  utilities *puVar7;
  int iVar8;
  int j;
  ulong uVar9;
  array<unsigned_char,_4UL> char_array_4;
  undefined4 local_40;
  byte local_3b [3];
  utilities *local_38;
  
  local_40 = 0;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_38 = this;
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __return_storage_ptr__,(size_type)this);
  uVar9 = 0;
  for (puVar7 = (utilities *)0x0; iVar8 = (int)uVar9, local_38 != puVar7; puVar7 = puVar7 + 1) {
    uVar1 = puVar7[encoded_string._M_len + (long)(int)encoded_string._M_str];
    if (((ulong)(byte)uVar1 == 0x3d) || (b64Map[(byte)uVar1] == -1)) break;
    uVar9 = (ulong)(iVar8 + 1U);
    *(utilities *)((long)&local_40 + (long)iVar8) = uVar1;
    uVar5 = local_40;
    if (iVar8 + 1U == 4) {
      uVar9 = (ulong)(byte)local_40;
      bVar2 = b64Map[local_40._1_1_];
      local_40._2_1_ = SUB41(uVar5,2);
      bVar3 = b64Map[local_40._2_1_];
      local_40._3_1_ = SUB41(uVar5,3);
      cVar4 = b64Map[local_40._3_1_];
      local_40 = CONCAT13(cVar4,CONCAT12(bVar3,CONCAT11(bVar2,b64Map[uVar9])));
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                __return_storage_ptr__,bVar2 >> 4 & 3 | b64Map[uVar9] << 2);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                __return_storage_ptr__,bVar2 << 4 | bVar3 >> 2 & 0xf);
      uVar9 = 0;
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                __return_storage_ptr__,cVar4 + bVar3 * '@');
    }
  }
  if (0 < iVar8) {
    puVar6 = (undefined1 *)((long)&local_40 + uVar9);
    for (; (int)uVar9 < 4; uVar9 = (ulong)((int)uVar9 + 1)) {
      *puVar6 = 0;
      puVar6 = puVar6 + 1;
    }
    local_3b[0] = (byte)b64Map[local_40._1_1_] >> 4 & 3 | b64Map[(byte)local_40] << 2;
    local_3b[1] = (byte)b64Map[local_40._2_1_] >> 2 & 0xf | b64Map[local_40._1_1_] << 4;
    local_3b[2] = b64Map[local_40._2_1_] * '@' + b64Map[local_40._3_1_];
    for (uVar9 = 0; iVar8 - 1 != uVar9; uVar9 = uVar9 + 1) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                __return_storage_ptr__,local_3b[uVar9]);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
    base64_decode_to_string(std::string_view encoded_string, size_t offset)
{
    auto in_len = encoded_string.size();
    int indexOut{0};
    int indexIn{static_cast<int>(offset)};
    std::array<unsigned char, 3> char_array_3{{0U, 0U, 0U}};
    std::array<unsigned char, 4> char_array_4{{0U, 0U, 0U, 0U}};
    std::string ret;
    ret.reserve(in_len);

    while (((in_len--) != 0U) && (encoded_string[indexIn] != '=') &&
           isBase64(encoded_string[indexIn])) {
        char_array_4[indexOut++] = encoded_string[indexIn];
        indexIn++;
        if (indexOut == 4) {
            char_array_4[0] = b64Map[char_array_4[0]];
            char_array_4[1] = b64Map[char_array_4[1]];
            char_array_4[2] = b64Map[char_array_4[2]];
            char_array_4[3] = b64Map[char_array_4[3]];

            char_array_3[0] =
                (char_array_4[0] << 2U) + ((char_array_4[1] & 0x30U) >> 4U);
            char_array_3[1] = ((char_array_4[1] & 0xfU) << 4U) +
                ((char_array_4[2] & 0x3cU) >> 2U);
            char_array_3[2] =
                ((char_array_4[2] & 0x3U) << 6U) + char_array_4[3];

            ret.push_back(char_array_3[0]);
            ret.push_back(char_array_3[1]);
            ret.push_back(char_array_3[2]);

            indexOut = 0;
        }
    }

    if (indexOut > 0) {
        for (int j = indexOut; j < 4; j++) {
            char_array_4[j] = 0;
        }
        char_array_4[0] = b64Map[char_array_4[0]];
        char_array_4[1] = b64Map[char_array_4[1]];
        char_array_4[2] = b64Map[char_array_4[2]];
        char_array_4[3] = b64Map[char_array_4[3]];

        char_array_3[0] =
            (char_array_4[0] << 2U) + ((char_array_4[1] & 0x30U) >> 4U);
        char_array_3[1] = ((char_array_4[1] & 0xfU) << 4U) +
            ((char_array_4[2] & 0x3cU) >> 2U);
        char_array_3[2] = ((char_array_4[2] & 0x3U) << 6U) + char_array_4[3];

        for (int j = 0; (j < indexOut - 1); j++) {
            ret.push_back(char_array_3[j]);
        }
    }

    return ret;
}